

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

QWidget * __thiscall QSplitter::replaceWidget(QSplitter *this,int index,QWidget *widget)

{
  bool bVar1;
  uint uVar2;
  QSplitterPrivate *this_00;
  QSplitterLayoutStruct *pQVar3;
  QWidgetData *pQVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  QWidget *this_01;
  char *pcVar10;
  long in_FS_OFFSET;
  QRect local_58;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    pcVar10 = "QSplitter::replaceWidget: Widget can\'t be null";
  }
  else {
    if ((index < 0) ||
       (this_00 = *(QSplitterPrivate **)&(this->super_QFrame).super_QWidget.field_0x8,
       (ulong)(this_00->list).d.size <= (ulong)(uint)index)) {
      local_58.x1.m_i = 2;
      local_44 = 0;
      local_58.y1.m_i = 0;
      local_58.x2.m_i = 0;
      local_58.y2.m_i = 0;
      uStack_48 = 0;
      local_40 = "default";
      this_01 = (QWidget *)0x0;
      QMessageLogger::warning((char *)&local_58,"QSplitter::replaceWidget: Index %d out of range");
      goto LAB_00448d1a;
    }
    pQVar3 = (this_00->list).d.ptr[(uint)index];
    this_01 = pQVar3->widget;
    if (this_01 == widget) {
      pcVar10 = "QSplitter::replaceWidget: Trying to replace a widget with itself";
    }
    else {
      if (*(QSplitter **)(*(long *)&widget->field_0x8 + 0x10) != this) {
        bVar1 = this_00->blockChildAdd;
        this_00->blockChildAdd = true;
        pQVar4 = this_01->data;
        uVar5 = (pQVar4->crect).x1;
        uVar6 = (pQVar4->crect).y1;
        uVar7 = (pQVar4->crect).x2;
        uVar8 = (pQVar4->crect).y2;
        uVar2 = pQVar4->widget_attributes;
        pQVar3->widget = widget;
        local_58.x1.m_i = uVar5;
        local_58.y1.m_i = uVar6;
        local_58.x2.m_i = uVar7;
        local_58.y2.m_i = uVar8;
        QWidget::setParent(this_01,(QWidget *)0x0);
        QWidget::setParent(widget,(QWidget *)this);
        QWidget::setGeometry(widget,&local_58);
        QWidget::lower(widget);
        if ((uVar2 >> 0x10 & 1) == 0) {
          bVar9 = QSplitterPrivate::shouldShowWidget(this_00,widget);
          if (bVar9) {
            QWidget::show(widget);
          }
        }
        else {
          QWidget::hide(widget);
        }
        this_00->blockChildAdd = bVar1;
        goto LAB_00448d1a;
      }
      pcVar10 = "QSplitter::replaceWidget: Trying to replace a widget with one of its siblings";
    }
  }
  local_40 = "default";
  local_44 = 0;
  uStack_48 = 0;
  local_58.y2.m_i = 0;
  local_58.x2.m_i = 0;
  local_58.y1.m_i = 0;
  local_58.x1.m_i = 2;
  this_01 = (QWidget *)0x0;
  QMessageLogger::warning((char *)&local_58,pcVar10);
LAB_00448d1a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QSplitter::replaceWidget(int index, QWidget *widget)
{
    Q_D(QSplitter);
    if (!widget) {
        qWarning("QSplitter::replaceWidget: Widget can't be null");
        return nullptr;
    }

    if (index < 0 || index >= d->list.size()) {
        qWarning("QSplitter::replaceWidget: Index %d out of range", index);
        return nullptr;
    }

    QSplitterLayoutStruct *s = d->list.at(index);
    QWidget *current = s->widget;
    if (current == widget) {
        qWarning("QSplitter::replaceWidget: Trying to replace a widget with itself");
        return nullptr;
    }

    if (widget->parentWidget() == this) {
        qWarning("QSplitter::replaceWidget: Trying to replace a widget with one of its siblings");
        return nullptr;
    }

    QScopedValueRollback b(d->blockChildAdd, true);

    const QRect geom = current->geometry();
    const bool wasHidden = current->isHidden();

    s->widget = widget;
    current->setParent(nullptr);
    widget->setParent(this);

    // The splitter layout struct's geometry is already set and
    // should not change. Only set the geometry on the new widget
    widget->setGeometry(geom);
    widget->lower();
    if (wasHidden)
        widget->hide();
    else if (d->shouldShowWidget(widget))
        widget->show();

    return current;
}